

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O3

string * __thiscall
gimage::(anonymous_namespace)::readRAWHeader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *name,int *type,
          bool *msbfirst,long *width,long *height)

{
  uint *puVar1;
  long lVar2;
  istream *piVar3;
  string *extraout_RAX;
  string *psVar4;
  IOException *this_00;
  long *plVar5;
  size_type *psVar6;
  char sep2;
  char sep1;
  char order;
  string s;
  istringstream in;
  char local_243;
  char local_242;
  allocator local_241;
  string local_240;
  int *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  string *local_210;
  long local_208;
  undefined1 local_200 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0 [2];
  ios_base local_138 [264];
  
  local_220 = (int *)name;
  std::__cxx11::string::string((string *)&local_210,(char *)this,(allocator *)local_1b0);
  local_218 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_218;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar2 = std::__cxx11::string::find((char)(string *)&local_210,0x26);
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::replace((ulong)&local_210,local_208 - 4,(char *)0x4,0x12f08d);
    gutil::Properties::Properties((Properties *)local_1b0,(char *)local_210);
    gutil::Properties::getValue<long>
              ((Properties *)local_1b0,"image.width",(long *)msbfirst,(char *)0x0);
    gutil::Properties::getValue<long>((Properties *)local_1b0,"image.height",width,(char *)0x0);
    gutil::Properties::getValue<int>
              ((Properties *)local_1b0,"image.pixelsize",local_220,(char *)0x0);
    gutil::Properties::getValue<bool>((Properties *)local_1b0,"image.msbfirst",(bool *)type,"false")
    ;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_1b0);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_240,(ulong)&local_210);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_240,_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    local_242 = '\0';
    local_243 = '\0';
    puVar1 = (uint *)((long)&local_1b0[0]._M_impl.super__Rb_tree_header._M_header._M_left +
                     *(long *)(local_1b0[0]._M_impl._0_8_ + -0x18));
    *puVar1 = *puVar1 & 0xffffefff;
    piVar3 = std::istream::_M_extract<long>((long *)local_1b0);
    piVar3 = std::operator>>(piVar3,&local_242);
    piVar3 = std::istream::_M_extract<long>((long *)piVar3);
    piVar3 = std::operator>>(piVar3,&local_243);
    std::istream::operator>>((istream *)piVar3,local_220);
    if ((((*(byte *)((long)&local_1b0[0]._M_impl.super__Rb_tree_header._M_header._M_right +
                    *(long *)(local_1b0[0]._M_impl._0_8_ + -0x18)) & 5) != 0) || (local_242 != 'x'))
       || (local_243 != 'x')) {
      this_00 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)(local_200 + 0x10),(char *)this,&local_241);
      std::operator+(&local_1d0,"Wrong format of RAW header information (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_200 + 0x10));
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      local_240._M_dataplus._M_p = (pointer)*plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_240._M_dataplus._M_p == psVar6) {
        local_240.field_2._M_allocated_capacity = *psVar6;
        local_240.field_2._8_8_ = plVar5[3];
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar6;
      }
      local_240._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      gutil::IOException::IOException(this_00,&local_240);
      __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    *(undefined1 *)type = 0;
    if ((*(byte *)((long)&local_1b0[0]._M_impl.super__Rb_tree_header._M_header._M_right +
                  *(long *)(local_1b0[0]._M_impl._0_8_ + -0x18)) & 2) == 0) {
      std::operator>>((istream *)local_1b0,(char *)&local_240);
      if ((char)local_240._M_dataplus._M_p == 'm') {
        *(undefined1 *)type = 1;
      }
    }
    std::__cxx11::string::substr((ulong)&local_240,(ulong)&local_210);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  psVar4 = (string *)local_200;
  if (local_210 != psVar4) {
    operator_delete(local_210);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

std::string readRAWHeader(const char *name, int &type, bool &msbfirst, long &width,
                          long &height)
{
  std::string s=name;
  size_t pos;
  std::string ret;

  pos=s.find('&');

  if (pos != s.npos)
  {
    std::istringstream in(s.substr(pos+1));
    char sep1=0, sep2=0;

    in >> std::noskipws >> width >> sep1 >> height >> sep2 >> type;

    if (in.fail() || sep1 != 'x' || sep2 != 'x')
    {
      throw gutil::IOException("Wrong format of RAW header information ("+std::string(name)+")");
    }

    msbfirst=false;

    if (!in.eof())
    {
      char order;

      in >> order;

      if (order == 'm')
      {
        msbfirst=true;
      }
    }

    ret=s.substr(0, pos);
  }
  else
  {
    ret=s;
    s.replace(s.length()-4, 4, ".hdr");

    gutil::Properties prop(s.c_str());
    prop.getValue("image.width", width);
    prop.getValue("image.height", height);
    prop.getValue("image.pixelsize", type);
    prop.getValue("image.msbfirst", msbfirst, "false");
  }

  return ret;
}